

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZCompElHDivCollapsed.cpp
# Opt level: O2

void __thiscall
TPZCompElHDivCollapsed<pzshape::TPZShapeTriang>::InitMaterialDataT<std::complex<double>>
          (TPZCompElHDivCollapsed<pzshape::TPZShapeTriang> *this,
          TPZMaterialDataT<std::complex<double>_> *data)

{
  byte bVar1;
  byte bVar2;
  int *piVar3;
  int iVar4;
  TPZCompMesh *pTVar5;
  TPZConnect *pTVar6;
  TPZConnect *pTVar7;
  long lVar8;
  TPZGeoEl *pTVar9;
  int i_1;
  int i;
  ulong uVar10;
  int i_2;
  long lVar11;
  TPZManVector<int,_10> sideorient;
  TPZManVector<long,_3> ids;
  TPZManVector<int,_10> connectorders;
  
  pTVar5 = TPZCompEl::Mesh((TPZCompEl *)this);
  pTVar6 = TPZChunkVector<TPZConnect,_10>::operator[]
                     (&(pTVar5->fConnectVec).super_TPZChunkVector<TPZConnect,_10>,
                      this->fbottom_c_index);
  pTVar5 = TPZCompEl::Mesh((TPZCompEl *)this);
  pTVar7 = TPZChunkVector<TPZConnect,_10>::operator[]
                     (&(pTVar5->fConnectVec).super_TPZChunkVector<TPZConnect,_10>,this->ftop_c_index
                     );
  bVar1 = (pTVar7->field_2).fCompose.fOrder;
  bVar2 = (pTVar6->field_2).fCompose.fOrder;
  (**(code **)(*(long *)&(this->super_TPZCompElHDiv<pzshape::TPZShapeTriang>).
                         super_TPZIntelGen<pzshape::TPZShapeTriang>.super_TPZInterpolatedElement.
                         super_TPZInterpolationSpace.super_TPZCompEl + 600))(this);
  iVar4 = (**(code **)(*(long *)&(this->super_TPZCompElHDiv<pzshape::TPZShapeTriang>).
                                 super_TPZIntelGen<pzshape::TPZShapeTriang>.
                                 super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                 super_TPZCompEl + 0x90))(this);
  lVar11 = (long)iVar4;
  sideorient.super_TPZVec<int>._vptr_TPZVec._0_4_ = 0;
  TPZManVector<int,_10>::TPZManVector(&connectorders,lVar11,(int *)&sideorient);
  for (uVar10 = 0; uVar10 != 4; uVar10 = uVar10 + 1) {
    lVar8 = (**(code **)(*(long *)&(this->super_TPZCompElHDiv<pzshape::TPZShapeTriang>).
                                   super_TPZIntelGen<pzshape::TPZShapeTriang>.
                                   super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                   super_TPZCompEl + 0xa8))(this,uVar10 & 0xffffffff);
    connectorders.super_TPZVec<int>.fStore[uVar10] = (uint)*(byte *)(lVar8 + 0x14);
  }
  connectorders.super_TPZVec<int>.fStore[lVar11 + -2] = (uint)bVar2;
  connectorders.super_TPZVec<int>.fStore[lVar11 + -1] = (uint)bVar1;
  ids.super_TPZVec<long>._vptr_TPZVec._0_4_ = 0;
  TPZManVector<int,_10>::TPZManVector(&sideorient,5,(int *)&ids);
  piVar3 = (this->super_TPZCompElHDiv<pzshape::TPZShapeTriang>).fSideOrient.super_TPZVec<int>.fStore
  ;
  for (lVar11 = 0; lVar11 != 3; lVar11 = lVar11 + 1) {
    sideorient.super_TPZVec<int>.fStore[lVar11] = piVar3[lVar11];
  }
  iVar4 = (**(code **)(*(long *)&(this->super_TPZCompElHDiv<pzshape::TPZShapeTriang>).
                                 super_TPZIntelGen<pzshape::TPZShapeTriang>.
                                 super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                 super_TPZCompEl + 0x2f0))(this,6);
  sideorient.super_TPZVec<int>.fStore[3] = iVar4;
  iVar4 = (**(code **)(*(long *)&(this->super_TPZCompElHDiv<pzshape::TPZShapeTriang>).
                                 super_TPZIntelGen<pzshape::TPZShapeTriang>.
                                 super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                 super_TPZCompEl + 0x2f0))(this,7);
  sideorient.super_TPZVec<int>.fStore[4] = iVar4;
  pTVar9 = TPZCompEl::Reference((TPZCompEl *)this);
  TPZManVector<long,_3>::TPZManVector(&ids,3);
  for (uVar10 = 0; uVar10 != 3; uVar10 = uVar10 + 1) {
    lVar11 = (**(code **)(*(long *)pTVar9 + 0xa8))(pTVar9,uVar10 & 0xffffffff);
    ids.super_TPZVec<long>.fStore[uVar10] = lVar11;
  }
  TPZShapeHDivCollapsed<pzshape::TPZShapeTriang>::Initialize
            (&ids.super_TPZVec<long>,&connectorders.super_TPZVec<int>,&sideorient.super_TPZVec<int>,
             (TPZShapeData *)data);
  TPZManVector<long,_3>::~TPZManVector(&ids);
  TPZManVector<int,_10>::~TPZManVector(&sideorient);
  TPZManVector<int,_10>::~TPZManVector(&connectorders);
  return;
}

Assistant:

void TPZCompElHDivCollapsed<TSHAPE>::InitMaterialDataT(TPZMaterialDataT<TVar> &data)
{
    TPZShapeData& shapedata = data;
    
    // Order of top and bot connect
    TPZConnect& connbot = this->Mesh()->ConnectVec()[fbottom_c_index];
    TPZConnect& conntop = this->Mesh()->ConnectVec()[ftop_c_index];
    const int toporder = conntop.Order();
    const int bottomorder = connbot.Order();
    
    // Number of shape and dim
    const int64_t nvecshapecollpased = this->NShapeF();
    const int dim = TSHAPE::Dimension+1;
    
    // Order of connects
    int ncon = NConnects();
    TPZManVector<int> connectorders(ncon,0);
    for(int i=0; i<TSHAPE::NFacets+1; i++) connectorders[i] = this->Connect(i).Order();
    connectorders[ncon-2] = bottomorder;
    connectorders[ncon-1] = toporder;
    
    // Side orient
    TPZManVector<int> sideorient(TSHAPE::NFacets+2,0);
    for(int i=0; i<TSHAPE::NFacets; i++) sideorient[i] = this->SideOrient(i);
    sideorient[TSHAPE::NFacets] = GetSideOrient(TSHAPE::NSides-1);
    sideorient[TSHAPE::NFacets+1] = GetSideOrient(TSHAPE::NSides);
    
    // Node ids of geoel
    TPZGeoEl *gel = this->Reference();
    TPZManVector<int64_t,TSHAPE::NCornerNodes> ids(TSHAPE::NCornerNodes);
    for(int i=0; i<TSHAPE::NCornerNodes; i++) ids[i] = gel->NodeIndex(i);
    
    // Init shape data
    TPZShapeHDivCollapsed<TSHAPE>::Initialize(ids, connectorders, sideorient, shapedata);

#ifdef PZ_LOG
    if (logger.isDebugEnabled())
	{
        std::stringstream sout;
        sout << "After InitMaterialData\n";
        data.Print(sout);
		LOGPZ_DEBUG(logger,sout.str())
	}
#endif
    
}